

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PromiseReceive.h
# Opt level: O1

void brynet::net::memsearch
               (char *hay,size_t haysize,char *needle,size_t needlesize,size_t *result,bool *isOK)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  uVar2 = 0;
  do {
    sVar3 = 0;
    sVar4 = sVar3;
    if (needlesize != 0) {
      do {
        sVar4 = sVar3;
        if (hay[sVar3] != needle[sVar3]) break;
        sVar3 = sVar3 + 1;
        sVar4 = needlesize;
      } while (needlesize != sVar3);
    }
    if (sVar4 == needlesize) {
      *result = uVar2;
      bVar1 = true;
      goto LAB_001075b7;
    }
    uVar2 = uVar2 + 1;
    hay = hay + 1;
    if (haysize - needlesize < uVar2) {
      bVar1 = false;
LAB_001075b7:
      *isOK = bVar1;
      return;
    }
  } while( true );
}

Assistant:

void memsearch(const char *hay, size_t haysize, const char *needle, size_t needlesize, size_t& result, bool& isOK)
        {
            size_t haypos, needlepos;
            haysize -= needlesize;

            for (haypos = 0; haypos <= haysize; haypos++)
            {
                for (needlepos = 0; needlepos < needlesize; needlepos++)
                {
                    if (hay[haypos + needlepos] != needle[needlepos])
                    {
                        // Next character in haystack.
                        break;
                    }
                }
                if (needlepos == needlesize)
                {
                    result = haypos;
                    isOK = true;
                    return;
                }
            }

            isOK = false;
        }